

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

void __thiscall FPolyObj::UpdateLinks(FPolyObj *this)

{
  int key;
  bool bVar1;
  uint uVar2;
  line_t_conflict **pplVar3;
  bool *pbVar4;
  TVector2<double> local_d0;
  undefined1 local_c0 [8];
  DVector2 delta;
  bool *done;
  undefined1 local_a0 [4];
  int destgroup;
  FLinePortal *local_90;
  FLinePortal *port2;
  TVector2<double> local_78;
  TVector2<double> local_68;
  undefined1 local_58 [8];
  DVector2 old;
  FLinePortal *port;
  uint local_2c;
  undefined1 local_28 [4];
  uint i;
  TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> processed;
  FPolyObj *this_local;
  
  if (this->bHasPortals == '\x02') {
    processed._16_8_ = this;
    TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::TMap
              ((TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)local_28);
    for (local_2c = 0; uVar2 = TArray<line_t_*,_line_t_*>::Size(&this->Linedefs), local_2c < uVar2;
        local_2c = local_2c + 1) {
      pplVar3 = TArray<line_t_*,_line_t_*>::operator[](&this->Linedefs,(ulong)local_2c);
      bVar1 = line_t::isLinePortal((line_t *)*pplVar3);
      if (bVar1) {
        pplVar3 = TArray<line_t_*,_line_t_*>::operator[](&this->Linedefs,(ulong)local_2c);
        old.Y = (double)line_t::getPortal((line_t *)*pplVar3);
        if (((FLinePortal *)old.Y)->mType == '\x03') {
          TVector2<double>::TVector2
                    ((TVector2<double> *)local_58,&((FLinePortal *)old.Y)->mDisplacement);
          vertex_t::fPos((vertex_t *)&local_78);
          vertex_t::fPos((vertex_t *)&port2);
          TVector2<double>::operator-(&local_68,&local_78);
          TVector2<double>::operator=((TVector2<double> *)((long)old.Y + 0x10),&local_68);
          local_90 = line_t::getPortal(*(line_t **)((long)old.Y + 8));
          if (local_90 != (FLinePortal *)0x0) {
            TVector2<double>::operator-((TVector2<double> *)local_a0);
            TVector2<double>::operator=(&local_90->mDisplacement,(TVector2<double> *)local_a0);
          }
          key = *(int *)(*(long *)(*(long *)((long)old.Y + 8) + 0x78) + 0x208);
          delta.Y = (double)TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::CheckKey
                                      ((TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)
                                       local_28,key);
          if (((bool *)delta.Y == (bool *)0x0) || ((*(bool *)delta.Y & 1U) == 0)) {
            pbVar4 = TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::operator[]
                               ((TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)local_28,
                                key);
            *pbVar4 = true;
            TVector2<double>::operator-
                      ((TVector2<double> *)local_c0,(TVector2<double> *)((long)old.Y + 0x10));
            TVector2<double>::TVector2(&local_d0,(TVector2<double> *)local_c0);
            FDisplacementTable::MoveGroup(&Displacements,key,&local_d0);
          }
        }
      }
    }
    TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::~TMap
              ((TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)local_28);
  }
  return;
}

Assistant:

void FPolyObj::UpdateLinks()
{
	if (bHasPortals == 2)
	{
		TMap<int, bool> processed;
		for (unsigned i = 0; i < Linedefs.Size(); i++)
		{
			if (Linedefs[i]->isLinePortal())
			{
				FLinePortal *port = Linedefs[i]->getPortal();
				if (port->mType == PORTT_LINKED)
				{
					DVector2 old = port->mDisplacement;
					port->mDisplacement = port->mDestination->v2->fPos() - port->mOrigin->v1->fPos();
					FLinePortal *port2 = port->mDestination->getPortal();
					if (port2) port2->mDisplacement = -port->mDisplacement;
					int destgroup = port->mDestination->frontsector->PortalGroup;
					bool *done = processed.CheckKey(destgroup);
					if (!done || !*done)
					{
						processed[destgroup] = true;
						DVector2 delta = port->mDisplacement - old;
						Displacements.MoveGroup(destgroup, delta);
					}
				}
			}
		}
	}
}